

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O2

void __thiscall RSA::print_last_key(RSA *this)

{
  ostream *poVar1;
  string sStack_68;
  BigInt local_48;
  
  std::__cxx11::string::string((string *)&sStack_68,"Public Key Pair",(allocator *)&local_48);
  Crypto::print_header(&this->super_Crypto,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"e: ");
  poVar1 = operator<<(poVar1,&this->e);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"n: ");
  poVar1 = operator<<(poVar1,&this->n);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&sStack_68,"Private Key Pair",(allocator *)&local_48);
  Crypto::print_header(&this->super_Crypto,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"d: ");
  poVar1 = operator<<(poVar1,&this->d);
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"n: ");
  poVar1 = operator<<(poVar1,&this->n);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&sStack_68,"(E*D)%Phi",(allocator *)&local_48);
  Crypto::print_header(&this->super_Crypto,&sStack_68);
  std::__cxx11::string::~string((string *)&sStack_68);
  poVar1 = std::operator<<((ostream *)&std::cout,"Euler Identity: (E*D)%Phi=");
  BigInt::operator*(&local_48,&this->e,&this->d);
  BigInt::operator%((BigInt *)&sStack_68,&local_48,&this->phi);
  poVar1 = operator<<(poVar1,(BigInt *)&sStack_68);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&sStack_68);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_48);
  return;
}

Assistant:

void RSA::print_last_key() {
    print_header("Public Key Pair");
    cout << "e: " << e << endl << "n: " << n << endl;

    print_header("Private Key Pair");
    cout << "d: " << d << endl << "n: " << n << endl;

    print_header("(E*D)%Phi");
    cout << "Euler Identity: (E*D)%Phi=" << (e * d) % phi << endl;
}